

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O2

bool __thiscall eglu::FilterList::match(FilterList *this,CandidateConfig *candidate)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  undefined8 *puVar4;
  
  puVar2 = *(undefined8 **)this;
  do {
    puVar4 = puVar2;
    puVar1 = *(undefined8 **)(this + 8);
    if (puVar4 == puVar1) break;
    cVar3 = (*(code *)*puVar4)(candidate);
    puVar2 = puVar4 + 1;
  } while (cVar3 != '\0');
  return puVar4 == puVar1;
}

Assistant:

bool FilterList::match (const CandidateConfig& candidate) const
{
	for (vector<ConfigFilter>::const_iterator filterIter = m_rules.begin(); filterIter != m_rules.end(); filterIter++)
	{
		ConfigFilter filter = *filterIter;

		if (!filter(candidate))
			return false;
	}

	return true;
}